

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

void __thiscall QDnsLookupRunnable::run(QDnsLookupRunnable *this)

{
  long lVar1;
  bool bVar2;
  QMessageLogger *this_00;
  QLoggingCategory *this_01;
  QDebug *o;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QDnsLookupReply reply;
  QDnsLookupReply *in_stack_00000288;
  QDnsLookupReply *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int line;
  QDebug *this_02;
  Error in_stack_fffffffffffffea4;
  QDnsLookupRunnable *in_stack_fffffffffffffea8;
  QDebug *in_stack_fffffffffffffeb0;
  QList<QDnsServiceRecord> *in_stack_fffffffffffffeb8;
  QDebug local_140;
  QDebug in_stack_fffffffffffffec8;
  QDebug local_130;
  QDebug local_128 [4];
  undefined8 local_108;
  ulong local_100;
  int local_f8 [2];
  QString aQStack_f0 [6];
  QDnsLookupRunnable *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  memset(local_f8,0xaa,0xf0);
  QDnsLookupReply::QDnsLookupReply
            ((QDnsLookupReply *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  this_00 = (QMessageLogger *)QByteArray::size((QByteArray *)(in_RDI + 4));
  if (((long)this_00 < 0x100) && (this_00 != (QMessageLogger *)0x0)) {
    query(in_stack_ffffffffffffffb0,in_stack_00000288);
    qt_qdnsmailexchangerecord_sort((QList<QDnsMailExchangeRecord> *)in_stack_fffffffffffffea8);
    qt_qdnsservicerecord_sort(in_stack_fffffffffffffeb8);
  }
  else {
    local_f8[0] = 3;
    QDnsLookup::tr((char *)in_RDI,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (QString *)in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x340daa);
  }
  finished((QDnsLookupRunnable *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
           in_stack_fffffffffffffe78);
  line = local_f8[0];
  if ((local_f8[0] != 0) && ((local_f8[0] == 1 || ((local_f8[0] != 2 && (local_f8[0] - 3U < 2))))))
  {
    local_108 = 0xaaaaaaaaaaaaaaaa;
    local_100 = 0xaaaaaaaaaaaaaaaa;
    this_01 = lcDnsLookup();
    QLoggingCategory::operator()(this_01);
    anon_unknown.dwarf_864df6::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)CONCAT44(line,in_stack_fffffffffffffe80)
               ,(QLoggingCategory *)in_stack_fffffffffffffe78);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_108), bVar2) {
      anon_unknown.dwarf_864df6::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x340e9f);
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_RDI,line,(char *)in_stack_fffffffffffffe78,(char *)0x340eb5);
      QMessageLogger::warning();
      QDebug::nospace(&local_140);
      o = QDebug::operator<<(this_02,(char *)in_stack_fffffffffffffec8.stream);
      QDebug::QDebug((QDebug *)&stack0xfffffffffffffec8,o);
      ::operator<<((QDebug *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      in_stack_fffffffffffffe78 =
           (QDnsLookupReply *)QDebug::operator<<(this_02,(char *)in_stack_fffffffffffffec8.stream);
      QtPrivate::asString(aQStack_f0);
      QString::utf16();
      QDebug::operator<<((QDebug *)CONCAT44(line,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe78);
      QDebug::operator<<(this_02,(char *)in_stack_fffffffffffffec8.stream);
      ::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      QDebug::~QDebug(local_128);
      QDebug::~QDebug(&local_130);
      QDebug::~QDebug((QDebug *)&stack0xfffffffffffffec8);
      QDebug::~QDebug(&local_140);
      local_100 = local_100 & 0xffffffffffffff00;
    }
  }
  QDnsLookupReply::~QDnsLookupReply((QDnsLookupReply *)CONCAT44(line,in_stack_fffffffffffffe80));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDnsLookupRunnable::run()
{
    QDnsLookupReply reply;

    // Validate input.
    if (qsizetype n = requestName.size(); n > MaxDomainNameLength || n == 0) {
        reply.error = QDnsLookup::InvalidRequestError;
        reply.errorString = QDnsLookup::tr("Invalid domain name");
    } else {
        // Perform request.
        query(&reply);

        // Sort results.
        qt_qdnsmailexchangerecord_sort(reply.mailExchangeRecords);
        qt_qdnsservicerecord_sort(reply.serviceRecords);
    }

    emit finished(reply);

    // maybe print the lookup error as warning
    switch (reply.error) {
    case QDnsLookup::NoError:
    case QDnsLookup::OperationCancelledError:
    case QDnsLookup::NotFoundError:
    case QDnsLookup::ServerFailureError:
    case QDnsLookup::ServerRefusedError:
    case QDnsLookup::TimeoutError:
        break;      // no warning for these

    case QDnsLookup::ResolverError:
    case QDnsLookup::InvalidRequestError:
    case QDnsLookup::InvalidReplyError:
        qCWarning(lcDnsLookup()).nospace()
                << "DNS lookup failed (" << reply.error << "): "
              << qUtf16Printable(reply.errorString)
              << "; request was " << this;  // continues below
    }
}